

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall
QtPrivate::QColorLuminancePicker::paintEvent(QColorLuminancePicker *this,QPaintEvent *param_2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  const_pointer pvVar5;
  size_type sVar6;
  long in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  int y;
  QPalette *g;
  uint *end;
  uint *pixel;
  int y_1;
  int hi;
  int wi;
  int w;
  QPainter p;
  QImage img;
  QRect r;
  array<QPoint,_3UL> points;
  int in_stack_fffffffffffffec8;
  ImageConversionFlag in_stack_fffffffffffffecc;
  QColorLuminancePicker *in_stack_fffffffffffffed0;
  QPoint this_00;
  QRect *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  array<QPoint,_3UL> *this_01;
  QPainter *in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef0;
  QPainter *pQVar8;
  QPalette *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  QPainter *in_stack_ffffffffffffff10;
  QPainter *local_b0;
  int local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined4 local_64;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined2 local_2c;
  array<QPoint,_3UL> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QWidget::width((QWidget *)0x732a5e);
  iVar1 = iVar1 + -5;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::height((QWidget *)0x732a9b);
  QRect::QRect(in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
               (int)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
  iVar2 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  iVar2 = iVar2 + -2;
  iVar3 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  iVar3 = iVar3 + -2;
  if (*(long *)(in_RDI + 0x38) != 0) {
    iVar4 = QPixmap::height();
    if (iVar4 == iVar3) {
      iVar4 = QPixmap::width();
      if (iVar4 == iVar2) goto LAB_00732d22;
    }
  }
  if (*(long **)(in_RDI + 0x38) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x38) + 8))();
  }
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_60,iVar2,iVar3,Format_RGB32);
  local_b0 = (QPainter *)QImage::scanLine((int)&local_60);
  for (local_a8 = 0; local_a8 < iVar3; local_a8 = local_a8 + 1) {
    pQVar8 = local_b0 + (long)iVar2 * 4;
    in_stack_ffffffffffffff08 = *(int *)(in_RDI + 0x2c);
    in_stack_ffffffffffffff0c = *(int *)(in_RDI + 0x30);
    iVar4 = y2val(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    auVar7 = QColor::fromHsv(in_stack_ffffffffffffff08,in_stack_ffffffffffffff0c,iVar4,0xff);
    local_38 = auVar7._0_8_;
    local_78._8_4_ = auVar7._8_4_;
    local_30 = local_78._8_4_;
    local_78._12_2_ = auVar7._12_2_;
    local_2c = local_78._12_2_;
    local_78 = auVar7;
    local_64 = QColor::rgb();
    std::fill<unsigned_int*,unsigned_int>
              ((uint *)in_stack_fffffffffffffed0,
               (uint *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (uint *)0x732caa);
    in_stack_ffffffffffffff10 = local_b0;
    local_b0 = pQVar8;
  }
  in_stack_ffffffffffffff00 = (QPalette *)operator_new(0x18);
  QFlags<Qt::ImageConversionFlag>::QFlags
            ((QFlags<Qt::ImageConversionFlag> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
  ;
  QPixmap::fromImage((QImage *)in_stack_ffffffffffffff00,(QFlags_conflict1 *)&local_60);
  *(QPalette **)(in_RDI + 0x38) = in_stack_ffffffffffffff00;
  QImage::~QImage((QImage *)&local_60);
LAB_00732d22:
  this_00 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_88[0] = &DAT_aaaaaaaaaaaaaaaa;
  pQVar8 = (QPainter *)local_88;
  QPainter::QPainter(pQVar8,(QPaintDevice *)(in_RDI + 0x10));
  iVar2 = 1;
  QPainter::drawPixmap
            (in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
             (int)in_stack_fffffffffffffee0,(QPixmap *)in_stack_fffffffffffffed8);
  QWidget::palette((QWidget *)this_00);
  qDrawShadePanel(in_stack_ffffffffffffff10,
                  (QRect *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                  in_stack_ffffffffffffff00,SUB81((ulong)pQVar8 >> 0x38,0),(int)pQVar8,
                  (QBrush *)(ulong)in_stack_fffffffffffffef0);
  QPalette::windowText((QPalette *)0x732dbe);
  QBrush::color((QBrush *)0x732dc6);
  QPainter::setPen((QColor *)pQVar8);
  QPalette::windowText((QPalette *)0x732ddd);
  QPainter::setBrush((QBrush *)pQVar8);
  QWidget::height((QWidget *)0x732dff);
  QPainter::eraseRect(in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                      (int)in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20)
                      ,(int)in_stack_fffffffffffffed8);
  val2y((QColorLuminancePicker *)this_00,iVar1);
  local_28._M_elems[0] = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_28._M_elems[1] = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = &local_28;
  local_28._M_elems[2] = this_00;
  QPoint::QPoint((QPoint *)this_00,iVar1,iVar2);
  QPoint::QPoint((QPoint *)this_00,iVar1,iVar2);
  QPoint::QPoint((QPoint *)this_00,iVar1,iVar2);
  pvVar5 = std::array<QPoint,_3UL>::data((array<QPoint,_3UL> *)0x732eb5);
  iVar1 = (int)pvVar5;
  sVar6 = std::array<QPoint,_3UL>::size(this_01);
  QPainter::drawPolygon((QPoint *)pQVar8,iVar1,(FillRule)sVar6);
  QPainter::~QPainter(pQVar8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorLuminancePicker::paintEvent(QPaintEvent *)
{
    int w = width() - 5;

    QRect r(0, foff, w, height() - 2*foff);
    int wi = r.width() - 2;
    int hi = r.height() - 2;
    if (!pix || pix->height() != hi || pix->width() != wi) {
        delete pix;
        QImage img(wi, hi, QImage::Format_RGB32);
        int y;
        uint *pixel = (uint *) img.scanLine(0);
        for (y = 0; y < hi; y++) {
            uint *end = pixel + wi;
            std::fill(pixel, end, QColor::fromHsv(hue, sat, y2val(y + coff)).rgb());
            pixel = end;
        }
        pix = new QPixmap(QPixmap::fromImage(img));
    }
    QPainter p(this);
    p.drawPixmap(1, coff, *pix);
    const QPalette &g = palette();
    qDrawShadePanel(&p, r, g, true);
    p.setPen(g.windowText().color());
    p.setBrush(g.windowText());
    p.eraseRect(w, 0, 5, height());
    const int y = val2y(val);
    const std::array<QPoint, 3> points = {QPoint(w, y), QPoint(w + 5, y + 5), QPoint(w + 5, y - 5)};
    p.drawPolygon(points.data(), static_cast<int>(points.size()));
}